

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O2

void __thiscall
CNNTest_TestVaryingStridesVaryingDimImages_Test::TestBody
          (CNNTest_TestVaryingStridesVaryingDimImages_Test *this)

{
  long lVar1;
  undefined8 *puVar2;
  float *pfVar3;
  byte bVar4;
  float bias [1];
  CNN_THREAD_DATA thread_data;
  float expected_2 [12];
  float expected_1 [12];
  float expected_4 [16];
  float expected_3 [18];
  float weights [44];
  float input [408];
  CNN_CONFIG local_1eb8;
  
  bVar4 = 0;
  memcpy(weights,&DAT_00a93e30,0xb0);
  bias[0] = 2.0;
  memset(&local_1eb8,0,0x1e90);
  local_1eb8.num_layers = 1;
  local_1eb8.layer_config[0].in_channels = 1;
  local_1eb8.layer_config[0].filter_width = 4;
  local_1eb8.layer_config[0].filter_height = 0xb;
  local_1eb8.layer_config[0].out_channels = 1;
  local_1eb8.layer_config[0].skip_width = 7;
  local_1eb8.layer_config[0].skip_height = 6;
  local_1eb8.layer_config[0].activation = '\0';
  local_1eb8.layer_config[0].branch_combine_type = '\0';
  local_1eb8.layer_config[0].weights = weights;
  local_1eb8.layer_config[0].bias = bias;
  memcpy(input,&DAT_00a93ee0,0x660);
  expected_1[8] = -54.0;
  expected_1[9] = -14.0;
  expected_1[10] = 21.0;
  expected_1[0xb] = 121.0;
  expected_1[4] = 13.0;
  expected_1[5] = 83.0;
  expected_1[6] = -21.0;
  expected_1[7] = 53.0;
  expected_1[0] = 41.0;
  expected_1[1] = -26.0;
  expected_1[2] = 5.0;
  expected_1[3] = 76.0;
  thread_data.num_workers = 1;
  thread_data._4_4_ = 0;
  thread_data.workers = (AVxWorker *)0x0;
  anon_unknown.dwarf_4e9173::CNNTest::RunCNNTest
            (0x11,0x18,input,expected_1,&local_1eb8,0x11,&thread_data,0.0);
  local_1eb8.layer_config[0].skip_width = 6;
  local_1eb8.layer_config[0].skip_height = 7;
  expected_2[8] = 62.0;
  expected_2[9] = -37.0;
  expected_2[10] = 83.0;
  expected_2[0xb] = -3.0;
  expected_2[4] = 72.0;
  expected_2[5] = 127.0;
  expected_2[6] = -21.0;
  expected_2[7] = 103.0;
  expected_2[0] = 21.0;
  expected_2[1] = -50.0;
  expected_2[2] = 41.0;
  expected_2[3] = 20.0;
  anon_unknown.dwarf_4e9173::CNNTest::RunCNNTest
            (0x11,0x18,input,expected_2,&local_1eb8,0x11,&thread_data,0.0);
  local_1eb8.layer_config[0].skip_width = 3;
  local_1eb8.layer_config[0].skip_height = 10;
  puVar2 = &DAT_00a945a0;
  pfVar3 = expected_3;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)pfVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pfVar3 = pfVar3 + (ulong)bVar4 * -4 + 2;
  }
  anon_unknown.dwarf_4e9173::CNNTest::RunCNNTest
            (0x11,0x18,input,expected_3,&local_1eb8,0x11,&thread_data,0.0);
  local_1eb8.layer_config[0].skip_width = 10;
  local_1eb8.layer_config[0].skip_height = 3;
  expected_4[0xc] = 36.0;
  expected_4[0xd] = 19.0;
  expected_4[0xe] = -37.0;
  expected_4[0xf] = -45.0;
  expected_4[8] = 58.0;
  expected_4[9] = 85.0;
  expected_4[10] = 51.0;
  expected_4[0xb] = 66.0;
  expected_4[4] = 50.0;
  expected_4[5] = 40.0;
  expected_4[6] = 102.0;
  expected_4[7] = 81.0;
  expected_4[0] = 21.0;
  expected_4[1] = 49.0;
  expected_4[2] = 28.0;
  expected_4[3] = 87.0;
  anon_unknown.dwarf_4e9173::CNNTest::RunCNNTest
            (0x11,0x18,input,expected_4,&local_1eb8,0x11,&thread_data,0.0);
  return;
}

Assistant:

TEST_F(CNNTest, TestVaryingStridesVaryingDimImages) {
  float weights[] = {
    1,  -5, -3, -4, -1, 1,  2,  -3, 2,  2,  -1, 1,  -5, 1,  1,
    -3, -5, 3,  1,  4,  -2, -5, -2, -3, -5, 0,  -1, -5, 2,  -2,
    -2, 1,  -2, -4, 1,  3,  -2, 2,  0,  -3, 2,  -3, -2, -3,
  };
  float bias[] = { 2 };

  CNN_CONFIG cnn_config = { 1,
                            0,
                            0,
                            0,
                            0,
                            {
                                {
                                    1,
                                    4,
                                    11,
                                    1,
                                    7,
                                    6,
                                    0,
                                    weights,
                                    bias,
                                    PADDING_SAME_ZERO,
                                    NONE,
                                    0,
                                    0,
                                    BRANCH_NO_COPY,
                                    BRANCH_NOC,
                                    {},
                                    {},
                                    0,
                                },
                            } };

  int image_height = 24;
  int image_width = 17;
  float input[] = {
    -1, -3, 4,  4,  -5, 4,  3,  -5, -1, -3, 4,  -4, 2,  -3, 3,  -5, 2,  -1, -5,
    1,  -1, 3,  1,  -3, -3, 4,  0,  2,  -3, -5, -5, -4, 0,  -5, -2, -3, -1, -2,
    2,  -5, 4,  4,  0,  -4, -3, 1,  -3, -5, -4, -4, 1,  -2, -3, 3,  -3, -3, -1,
    -5, -5, -2, 3,  1,  -1, -5, -5, 1,  -4, -2, -1, -2, -4, -4, 2,  -2, 2,  1,
    -2, -4, -1, 1,  -2, -5, 3,  -2, -1, -1, -5, -3, 1,  -2, -2, -3, -1, -2, -4,
    -2, 1,  -4, -1, 4,  3,  -4, 0,  4,  2,  2,  4,  -3, -5, 2,  2,  1,  -1, -4,
    -2, 1,  3,  2,  0,  4,  -1, -3, 2,  1,  -4, 2,  2,  -4, -2, 0,  -2, -1, 4,
    4,  2,  3,  -4, 2,  -4, -5, 4,  -1, -3, -1, 0,  -4, 1,  3,  -1, -3, -5, 3,
    -2, -4, 1,  2,  -2, -3, -3, -5, 1,  -3, -1, 0,  -1, 3,  -4, -1, -5, -5, 1,
    0,  0,  -2, -2, 2,  -2, 0,  0,  2,  0,  -3, 0,  -1, -4, -4, -1, 3,  -4, -4,
    -1, 0,  -5, -3, -2, 4,  -3, -4, -4, 0,  -5, 1,  -2, -3, -3, -4, 4,  3,  4,
    3,  3,  -1, 3,  1,  -3, -2, 3,  3,  0,  2,  -4, -3, 2,  2,  0,  -2, 4,  -2,
    2,  -2, -1, -4, -2, 2,  -4, 3,  -1, 4,  1,  1,  4,  -1, -4, -4, 1,  1,  -2,
    4,  -1, 3,  2,  -3, 4,  3,  1,  4,  0,  -4, 2,  0,  2,  4,  -2, -2, 4,  2,
    -1, -2, 1,  -3, 2,  3,  -5, -3, 4,  4,  2,  -5, -4, -5, -2, -4, 2,  0,  2,
    -5, 4,  -4, -2, -5, 2,  1,  0,  4,  1,  -2, -3, -4, -3, -4, 3,  3,  2,  0,
    -3, 1,  -5, 4,  0,  4,  -1, 3,  -5, -5, -2, -1, -1, 4,  3,  3,  4,  3,  -4,
    4,  -3, -3, -1, -4, -1, -4, -1, -2, 4,  -2, -4, 4,  4,  -3, -4, -1, 1,  2,
    -1, -2, -2, 3,  2,  2,  -3, 0,  -1, 0,  3,  2,  -5, 0,  -4, 0,  0,  2,  -4,
    -1, -1, 0,  -2, 0,  1,  0,  0,  4,  -5, -1, -5, 2,  -1, 0,  2,  -1, 1,  3,
    -3, -5, -2, -3, 4,  -2, -2, -1, -3, -4, -1, -2, -4, 1,  4,  -3, -2, -1, 3,
    -3, -2, 3,  2,  1,  -4, -3, -5, 1,
  };
  float expected_1[] = {
    41, -26, 5, 76, 13, 83, -21, 53, -54, -14, 21, 121,
  };

  CNN_THREAD_DATA thread_data = { 1, nullptr };

  RunCNNTest(image_width, image_height, input, expected_1, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);

  cnn_config.layer_config[0].skip_width = 6;
  cnn_config.layer_config[0].skip_height = 7;

  float expected_2[] = {
    21, -50, 41, 20, 72, 127, -21, 103, 62, -37, 83, -3,
  };
  RunCNNTest(image_width, image_height, input, expected_2, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);

  cnn_config.layer_config[0].skip_width = 3;
  cnn_config.layer_config[0].skip_height = 10;

  float expected_3[] = {
    -26, -21, -35, 69, 49,  4,  -51, -43, -56,
    -41, 15,  -44, 40, -62, 63, 38,  27,  47,
  };
  RunCNNTest(image_width, image_height, input, expected_3, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);

  cnn_config.layer_config[0].skip_width = 10;
  cnn_config.layer_config[0].skip_height = 3;

  float expected_4[] = {
    21, 49, 28, 87, 50, 40, 102, 81, 58, 85, 51, 66, 36, 19, -37, -45,
  };

  RunCNNTest(image_width, image_height, input, expected_4, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);
}